

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

int __thiscall TPZMatrix<int>::Decompose_LU(TPZMatrix<int> *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int nn;
  int local_54;
  int local_50;
  int local_4c;
  long local_48;
  long local_40;
  long local_38;
  
  if (1 < (byte)(this->super_TPZBaseMatrix).fDecomposed) {
    Error("Decompose_LU <Matrix already Decomposed with other scheme>",(char *)0x0);
  }
  if ((this->super_TPZBaseMatrix).fDecomposed == '\0') {
    local_40 = (this->super_TPZBaseMatrix).fRow;
    lVar4 = (this->super_TPZBaseMatrix).fCol;
    if (lVar4 < local_40) {
      local_40 = lVar4;
    }
    if (0 < local_40) {
      lVar4 = 0;
      do {
        local_50 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                             (this,lVar4,lVar4);
        if (local_50 == 0) {
          Error("Decompose_LU <matrix is singular>",(char *)0x0);
        }
        lVar5 = lVar4 + 1;
        lVar6 = lVar5;
        if (lVar5 < (this->super_TPZBaseMatrix).fRow) {
          do {
            local_38 = lVar6;
            local_48 = lVar4;
            lVar6 = local_38;
            lVar4 = local_48;
            local_54 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                                 (this,lVar5,local_48);
            local_54 = local_54 / local_50;
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                      (this,lVar5,lVar4,&local_54);
            if (lVar6 < (this->super_TPZBaseMatrix).fCol) {
              do {
                iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                                  (this,lVar5,lVar6);
                iVar1 = local_54;
                iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                                  (this,local_48,lVar6);
                local_4c = iVar2 - iVar3 * iVar1;
                (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                          (this,lVar5,lVar6,&local_4c);
                lVar6 = lVar6 + 1;
              } while (lVar6 < (this->super_TPZBaseMatrix).fCol);
            }
            lVar5 = lVar5 + 1;
            lVar6 = local_38;
            lVar4 = local_48;
          } while (lVar5 < (this->super_TPZBaseMatrix).fRow);
        }
        lVar4 = lVar6;
      } while (lVar6 != local_40);
    }
    (this->super_TPZBaseMatrix).fDecomposed = '\x01';
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Decompose_LU() {
	
	if (  fDecomposed && fDecomposed != ELU)  Error( "Decompose_LU <Matrix already Decomposed with other scheme>" );
	if (fDecomposed) return 1;
	
	TVar nn, pivot;
	int64_t  min = ( Cols() < (Rows()) ) ? Cols() : Rows();
	
	for ( int64_t k = 0; k < min ; k++ ) {
		if (IsZero( pivot = GetVal(k, k))) Error( "Decompose_LU <matrix is singular>" );
		for ( int64_t i = k+1; i < Rows(); i++ ) {
			nn = GetVal( i, k ) / pivot;
			PutVal( i, k, nn );
			for ( int64_t j = k+1; j < Cols(); j++ ) PutVal(i,j,GetVal(i,j)-nn*GetVal(k,j));
		}
	}
	fDecomposed=ELU;
	return 1;
}